

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O1

void __thiscall
jsonrpccxx::Dispatcher::InvokeNotification(Dispatcher *this,string *name,json *params)

{
  iterator iVar1;
  JsonRpcException *this_00;
  json jVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>_>_>_>
          ::find(&(this->notifications)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->notifications)._M_t._M_impl.super__Rb_tree_header)
  {
    this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff98,"notification not found: ",name);
    JsonRpcException::JsonRpcException(this_00,-0x7f59,(string *)&stack0xffffffffffffff98);
    __cxa_throw(this_00,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  jVar2 = normalize_parameter((Dispatcher *)&stack0xffffffffffffff98,(string *)this,(json *)name);
  if (iVar1._M_node[2]._M_left != (_Base_ptr)0x0) {
    (*(code *)iVar1._M_node[2]._M_right)
              (iVar1._M_node + 2,&stack0xffffffffffffff98,jVar2.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&stack0xffffffffffffff98);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void InvokeNotification(const std::string &name, const json &params) {
      auto notification = notifications.find(name);
      if (notification == notifications.end()) {
        throw JsonRpcException(method_not_found, "notification not found: " + name);
      }
      try {
        notification->second(normalize_parameter(name, params));
      } catch (json::type_error &e) {
        throw JsonRpcException(invalid_params, "invalid parameter: " + std::string(e.what()));
      } catch (JsonRpcException &e) {
        throw process_type_error(name, e);
      }
    }